

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filetime.cpp
# Opt level: O3

BOOL FileTimeToDosDateTime(FILETIME *lpFileTime,LPWORD lpFatDate,LPWORD lpFatTime)

{
  BOOL BVar1;
  undefined1 local_30 [8];
  SYSTEMTIME SysTime;
  
  if (!PAL_InitializeChakraCoreCalled) goto LAB_0032d79f;
  if ((lpFatDate == (LPWORD)0x0 || lpFileTime == (FILETIME *)0x0) || lpFatTime == (LPWORD)0x0) {
LAB_0032d782:
    SetLastError(0x57);
    BVar1 = 0;
  }
  else {
    BVar1 = FileTimeToSystemTime(lpFileTime,(LPSYSTEMTIME)local_30);
    if ((BVar1 == 0) || (0x39 < (ushort)(local_30._0_2_ - 0x7bc))) {
      if (PAL_InitializeChakraCoreCalled == false) goto LAB_0032d79f;
      goto LAB_0032d782;
    }
    *lpFatDate = 0;
    *lpFatTime = 0;
    *lpFatDate = local_30._0_2_ * 0x200 + (local_30._2_2_ & 0xf) * 0x20 + 0x8800 |
                 local_30._6_2_ & 0x1f | *lpFatDate;
    *lpFatTime = SysTime.wYear << 0xb | (SysTime.wMonth & 0x3f) << 5 |
                 (SysTime.wDayOfWeek >> 1) + (SysTime.wDayOfWeek & 1) & 0x1f | *lpFatTime;
    BVar1 = 1;
  }
  if (PAL_InitializeChakraCoreCalled != false) {
    return BVar1;
  }
LAB_0032d79f:
  abort();
}

Assistant:

BOOL
PALAPI
FileTimeToDosDateTime(
            IN CONST FILETIME *lpFileTime,
            OUT LPWORD lpFatDate,
            OUT LPWORD lpFatTime )
{
    BOOL bRetVal = FALSE;

    PERF_ENTRY(FileTimeToDosDateTime);
    ENTRY( "FileTimeToDosDateTime( lpFileTime=%p, lpFatDate=%p, lpFatTime=%p )\n",
           lpFileTime, lpFatDate, lpFatTime );

    /* Sanity checks. */
    if ( !lpFileTime || !lpFatDate || !lpFatTime )
    {
        ERROR( "Incorrect parameters.\n" );
        SetLastError( ERROR_INVALID_PARAMETER );
    }
    else
    {
        /* Do conversion. */
        SYSTEMTIME SysTime;
        if ( FileTimeToSystemTime( lpFileTime, &SysTime ) )
        {
            if ( SysTime.wYear >= 1980 && SysTime.wYear <= 2037 )
            {
                *lpFatDate = 0;
                *lpFatTime = 0;

                *lpFatDate |= ( SysTime.wDay & 0x1F );
                *lpFatDate |= ( ( SysTime.wMonth & 0xF ) << 5 );
                *lpFatDate |= ( ( ( SysTime.wYear - 1980 ) & 0x7F ) << 9 );

                if ( SysTime.wSecond % 2 == 0 )
                {
                    *lpFatTime |= ( ( SysTime.wSecond / 2 )  & 0x1F );
                }
                else
                {
                    *lpFatTime |= ( ( SysTime.wSecond / 2 + 1 )  & 0x1F );
                }

                *lpFatTime |= ( ( SysTime.wMinute & 0x3F ) << 5 );
                *lpFatTime |= ( ( SysTime.wHour & 0x1F ) << 11 );
                
                bRetVal = TRUE;
            }
            else
            {
                ERROR( "The function can only repersent dates between 1/1/1980"
                       " and 12/31/2037\n" );
                SetLastError( ERROR_INVALID_PARAMETER );
            }
        }
        else
        {
            ERROR( "Unable to convert file time to system time.\n" );
            SetLastError( ERROR_INVALID_PARAMETER );
            bRetVal = FALSE;
        }
    }

    LOGEXIT( "returning BOOL %d\n", bRetVal );
    PERF_EXIT(FileTimeToDosDateTime);
    return bRetVal;
}